

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O3

int parse_defopcode(SymbolTable *sym,List *new)

{
  byte bVar1;
  char *__dest;
  long lVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  long lVar7;
  void *pvVar8;
  ListStruct *pLVar9;
  List *pLVar10;
  List *pLVar11;
  ListStruct *pLVar12;
  ulong uVar13;
  ListStruct *pLVar14;
  byte *__src;
  char **ppcVar15;
  char *pcVar16;
  char cVar17;
  long *plVar18;
  List *native;
  ulong uVar19;
  bool bVar20;
  long alStack_8970 [2];
  char *bits_to_expand [64] [64];
  char buf [256];
  List *pLStack_528;
  List *code_backup [64];
  int num_bits_to_expand [64];
  anon_union_8_7_0ba269be_for_u local_220;
  anon_union_8_7_0ba269be_for_u local_218;
  ListStruct *local_210;
  List *local_208;
  anon_union_8_7_0ba269be_for_u local_200;
  char acStack_1f8 [256];
  void *local_f8;
  undefined4 local_f0;
  undefined4 local_ec;
  undefined4 local_e8;
  undefined4 local_e4;
  ListStruct local_e0;
  List local_b0;
  SymbolTable *local_80;
  char **local_78;
  uint local_70;
  uint local_6c;
  void *local_68;
  ListStruct *local_60;
  ListStruct *local_58;
  long *local_50;
  ListStruct *local_48;
  ListStruct *local_40;
  ulong local_38;
  
  iVar5 = 0;
  local_b0.car = &local_e0;
  local_e0.car = (ListStruct *)0x0;
  local_b0.cdr = (ListStruct *)0x0;
  local_e0.token.filename = (new->token).filename;
  local_e0.token.lineno = (new->token).lineno;
  local_b0.token._4_4_ = *(undefined4 *)&(new->token).field_0x4;
  local_b0.token.filename._0_4_ = *(undefined4 *)&(new->token).filename;
  local_b0.token.filename._4_4_ = *(undefined4 *)((long)&(new->token).filename + 4);
  local_b0.token.lineno._0_4_ = (undefined4)(new->token).lineno;
  local_b0.token.lineno._4_4_ = *(undefined4 *)((long)&(new->token).lineno + 4);
  local_e0.token._4_4_ = SUB84((ulong)*(undefined8 *)&new->token >> 0x20,0);
  local_e0.token.type = TOK_DEFOPCODE;
  local_e0.token.u.string = "defopcode";
  local_b0.token.type = TOK_LIST;
  local_b0.token.u.string = (char *)0x0;
  local_e0.cdr = new;
  if (((new->token).type - TOK_IDENTIFIER < 2) && ((new->token).u.string != (char *)0x0)) {
    alStack_8970[0] = 0x106d3e;
    reduce(&local_b0,sym,0);
    iVar5 = 1;
    if (preprocess_only == FALSE) {
      pLVar10 = (local_b0.car)->cdr->cdr->car->cdr;
      alStack_8970[0] = 0x106d6f;
      uVar4 = list_length(&local_e0);
      alStack_8970[0] = 0x106d79;
      iVar5 = list_length(pLVar10);
      if (iVar5 == 4) {
        if ((int)uVar4 < 0x44) {
          alStack_8970[0] = 0x106df6;
          local_80 = sym;
          local_38 = (ulong)uVar4;
          memset(&local_218,0,0x138);
          local_220 = ((local_b0.car)->cdr->token).u;
          local_218.n._0_4_ = *(undefined4 *)&(pLVar10->token).u;
          local_210 = pLVar10->cdr;
          local_208 = local_210->cdr;
          if ((local_208->token).type == TOK_LIST) {
            pLVar14 = local_208->car;
            if (pLVar14 != (ListStruct *)0x0) {
              do {
                switch((pLVar14->token).type) {
                case TOK_ENDS_BLOCK:
                  local_f0 = 1;
                  break;
                case TOK_DONT_POSTINCDEC_UNEXPANDED:
                  local_e8 = 1;
                  break;
                case TOK_NEXT_BLOCK_DYNAMIC:
                  local_ec = 1;
                  break;
                case TOK_SKIP_TWO_OPERAND_WORDS:
                  local_e4 = 2;
                  break;
                case TOK_SKIP_FOUR_OPERAND_WORDS:
                case TOK_SKIP_ONE_POINTER:
                  local_e4 = 4;
                  break;
                case TOK_SKIP_TWO_POINTERS:
                  local_e4 = 8;
                  break;
                default:
                  alStack_8970[0] = 0x106e81;
                  pcVar16 = unparse_token(&pLVar14->token,(char *)(bits_to_expand[0x3f] + 0x3f));
                  alStack_8970[0] = 0x106e91;
                  parse_error(pLVar14,"Unknown misc flag: %s",pcVar16);
                }
                pLVar14 = pLVar14->cdr;
              } while (pLVar14 != (ListStruct *)0x0);
            }
          }
          else {
            alStack_8970[0] = 0x106edd;
            parse_error(local_208,"Expecting a list of misc flags!\n");
          }
          local_200.n = local_200.n & 0xffffffffffffff00;
          pLVar10 = pLVar10->cdr->cdr->cdr;
          if ((pLVar10->token).type == TOK_LIST) {
            iVar5 = (int)local_38;
            for (pLVar14 = pLVar10->car->cdr; pLVar14 != (ListStruct *)0x0; pLVar14 = pLVar14->cdr)
            {
              alStack_8970[0] = 0x106f14;
              strcat((char *)&local_200.n,(pLVar14->token).u.string);
            }
          }
          else {
            alStack_8970[0] = 0x106f2f;
            parse_error(pLVar10,"Expecting explicit list of opcode bits.\n");
            local_200 = (anon_union_8_7_0ba269be_for_u)0x3030303030303030;
            builtin_strncpy(acStack_1f8,"00000000",9);
            iVar5 = (int)local_38;
          }
          alStack_8970[0] = 0x106f51;
          sVar6 = strlen((char *)&local_200.n);
          if ((sVar6 & 0xf) != 0) {
            alStack_8970[0] = 0x106f66;
            parse_error(pLVar10,"Not a multiple of 16 opcode bits.\n");
            local_200 = (anon_union_8_7_0ba269be_for_u)0x3030303030303030;
            builtin_strncpy(acStack_1f8,"00000000",9);
          }
          lVar7 = (long)(int)(iVar5 - 3U);
          uVar13 = lVar7 * 0x28 + 0x27U & 0xfffffffffffffff0;
          lVar2 = -uVar13;
          local_50 = (long *)((long)alStack_8970 + lVar2 + 8);
          *(long *)((long)alStack_8970 + (8 - uVar13)) = lVar7 * 0x28 + 0x18;
          *(undefined8 *)((long)bits_to_expand + lVar2) = 0x940504fe;
          *(undefined4 *)((long)bits_to_expand + lVar7 * 0x28 + lVar2 + 0xc) = 0x595141ee;
          pvVar8 = (void *)((long)bits_to_expand + lVar2 + 8);
          *(undefined8 *)((long)alStack_8970 + lVar2) = 0x106fce;
          memset(pvVar8,0,lVar7 * 0x28);
          local_f8 = pvVar8;
          local_68 = pvVar8;
          if (3 < iVar5) {
            pLVar14 = (local_e0.cdr)->cdr;
            local_60 = (ListStruct *)(ulong)((int)local_38 - 4);
            ppcVar15 = bits_to_expand[(long)((long)&local_60[-1].token.lineno + 7)] + 0x3f;
            uVar4 = 0;
            local_6c = iVar5 - 3U;
            do {
              pLVar14 = pLVar14->cdr;
              if (local_60 != (ListStruct *)0x0) {
                pvVar8 = (void *)((long)local_68 + (long)local_60 * 0x28);
                *(void **)((long)pvVar8 + -8) = pvVar8;
              }
              pLVar9 = pLVar14->car->cdr;
              pcVar16 = (pLVar9->token).u.string;
              *(undefined8 *)((long)alStack_8970 + lVar2) = 0x107059;
              local_78 = ppcVar15;
              local_70 = uVar4;
              local_40 = local_60;
              local_60 = (ListStruct *)((long)&local_60[-1].token.lineno + 7);
              sVar6 = strlen(pcVar16);
              if (sVar6 != 5) {
                pLVar10 = pLVar9->cdr;
                *(undefined8 *)((long)alStack_8970 + lVar2) = 0x107070;
                parse_error(pLVar10,"Need exactly five characters in cc bits specification.\n");
                pcVar16 = "-----";
              }
              local_48 = (ListStruct *)((long)local_68 + (long)local_40 * 0x28);
              lVar7 = 0;
              do {
                uVar4 = 0xb;
                do {
                  if (parse_defopcode::cc_bit_info[uVar4].character == pcVar16[4 - lVar7]) {
                    bVar1 = parse_defopcode::cc_bit_info[uVar4].field_0x1;
                    bVar3 = (byte)lVar7;
                    uVar4 = *(uint *)&local_48->cdr;
                    *(uint *)&local_48->cdr =
                         (((bVar1 >> 3 & 1) << (bVar3 & 0x1f)) << 0x14 | uVar4) & 0x1f00000 |
                         (((bVar1 >> 2 & 1) << (bVar3 & 0x1f)) << 0xf | uVar4) & 0xf8000 |
                         ((bVar1 & 1) << (bVar3 & 0x1f) | uVar4) & 0xfe007c1f |
                         (((bVar1 >> 1 & 1) << (bVar3 & 0x1f)) << 5 | uVar4) & 0x3e0;
                    goto LAB_00107127;
                  }
                  bVar20 = uVar4 != 0;
                  uVar4 = uVar4 - 1;
                } while (bVar20);
                pLVar10 = pLVar14->car->cdr;
                *(undefined8 *)((long)alStack_8970 + lVar2) = 0x1070bb;
                parse_error(pLVar10,"Unknown character \'%c\' in cc bit specification.\n");
LAB_00107127:
                lVar7 = lVar7 + 1;
              } while (lVar7 != 5);
              pLVar10 = pLVar14->car->cdr->cdr;
              pcVar16 = (pLVar10->token).u.string;
              *(undefined8 *)((long)alStack_8970 + lVar2) = 0x10714e;
              local_58 = pLVar14;
              sVar6 = strlen(pcVar16);
              if (sVar6 != 5) {
                *(undefined8 *)((long)alStack_8970 + lVar2) = 0x107165;
                parse_error(pLVar10,"Need exactly five characters in cc bits specification.\n");
                pcVar16 = "-----";
              }
              pcVar16 = pcVar16 + 4;
              lVar7 = 0;
              do {
                cVar17 = *pcVar16;
                *(undefined8 *)((long)alStack_8970 + lVar2) = 0x10718e;
                pvVar8 = memchr("-CNVXZ",(int)cVar17,7);
                if (pvVar8 == (void *)0x0) {
                  pLVar10 = local_58->car->cdr->cdr;
                  *(undefined8 *)((long)alStack_8970 + lVar2) = 0x1071b2;
                  parse_error(pLVar10,
                              "Illegal character \'%c\' in cc bits needed specification.  Must be one of -,C,N,V,X,Z.\n"
                              ,(ulong)(uint)(int)cVar17);
                  cVar17 = *pcVar16;
                }
                pLVar14 = local_58;
                *(uint *)&local_48->cdr =
                     *(uint *)&local_48->cdr |
                     ((uint)(cVar17 != '-') << ((byte)lVar7 & 0x1f) & 0x1f) << 10;
                lVar7 = lVar7 + 1;
                pcVar16 = pcVar16 + -1;
              } while (lVar7 != 5);
              pLVar9 = local_58->car->cdr->cdr->cdr;
              pLVar10 = pLVar9->car;
              if ((pLVar10->token).type == TOK_EXPLICIT_LIST) {
                pLVar12 = pLVar10->cdr;
                if (pLVar12 == (ListStruct *)0x0) {
                  lVar7 = 0;
                }
                else {
                  lVar7 = 0;
                  do {
                    *(anon_union_8_7_0ba269be_for_u *)(local_78 + lVar7) = (pLVar12->token).u;
                    lVar7 = lVar7 + 1;
                    pLVar12 = pLVar12->cdr;
                  } while (pLVar12 != (ListStruct *)0x0);
                }
              }
              else {
                lVar7 = 0;
                *(undefined8 *)((long)alStack_8970 + lVar2) = 0x10722b;
                parse_error(pLVar10,"Expecting a list of bit pattern strings.\n");
                pLVar9 = pLVar14->car->cdr->cdr->cdr;
              }
              pLVar12 = local_40;
              ppcVar15 = local_78;
              iVar5 = (int)lVar7;
              num_bits_to_expand[(long)((long)&local_40[-1].token.lineno + 6)] = iVar5 + 1U;
              uVar4 = iVar5 + 1U;
              if (iVar5 < (int)local_70) {
                uVar4 = local_70;
              }
              bits_to_expand[(long)((long)&pLVar12[-1].token.lineno + 7)][(long)iVar5 + 0x3f] =
                   "----------------";
              pLVar12 = pLVar9->cdr;
              *(ListStruct **)&local_48->token = pLVar12;
              if ((((pLVar12 != (ListStruct *)0x0) &&
                   (pLVar10 = pLVar12->car, pLVar10 != (List *)0x0)) &&
                  ((pLVar10->token).type == TOK_NATIVE_CODE)) &&
                 (pLVar9 = pLVar12, (pLVar10->cdr->token).type != TOK_QUOTED_STRING)) {
                *(undefined8 *)((long)alStack_8970 + lVar2) = 0x1072aa;
                parse_error(pLVar10,"Faulty native code specifier.");
              }
              plVar18 = local_50;
              *(ListStruct **)&local_48->token = pLVar9->cdr;
              (local_48->token).u.string = (char *)0x0;
              ppcVar15 = ppcVar15 + -0x40;
            } while (0 < (long)local_40);
            uVar13 = (ulong)local_6c;
            if (3 < (int)local_38) {
              lVar7 = 0;
              do {
                pLVar10 = *(List **)((long)plVar18 + lVar7 + 0x20);
                *(undefined8 *)((long)alStack_8970 + lVar2) = 0x10730b;
                verify_fields_exist((char *)&local_200.n,pLVar10);
                lVar7 = lVar7 + 0x28;
              } while (uVar13 * 0x28 != lVar7);
              if (3 < (int)local_38) {
                plVar18 = local_50 + 4;
                uVar19 = 0;
                do {
                  *(undefined8 *)((long)alStack_8970 + lVar2) = 0x10732f;
                  pvVar8 = malloc(0x11);
                  plVar18[-1] = (long)pvVar8;
                  code_backup[uVar19 - 1] = (List *)*plVar18;
                  uVar19 = uVar19 + 1;
                  plVar18 = plVar18 + 5;
                } while (uVar13 != uVar19);
              }
            }
            if (0 < (int)uVar4) {
              local_58 = (ListStruct *)(ulong)uVar4;
              local_60 = (ListStruct *)(local_50 + 4);
              pLVar14 = (ListStruct *)0x0;
              local_40 = local_210;
LAB_00107376:
              local_48 = local_40->cdr;
              local_40->cdr = (ListStruct *)0x0;
              local_210 = local_40;
              if (3 < (int)local_38) {
                uVar19 = 0;
                pLVar9 = local_60;
                do {
                  pLVar10 = code_backup[uVar19 - 1];
                  *(undefined8 *)((long)alStack_8970 + lVar2) = 0x1073a2;
                  pLVar10 = copy_list(pLVar10);
                  pLVar9->cdr = pLVar10;
                  uVar19 = uVar19 + 1;
                  pLVar9 = (ListStruct *)&(pLVar9->token).lineno;
                } while (uVar13 != uVar19);
                if (3 < (int)local_38) {
                  uVar19 = 0;
LAB_001073be:
                  pcVar16 = "----------------";
                  if ((long)pLVar14 < (long)num_bits_to_expand[uVar19 - 2]) {
                    pcVar16 = bits_to_expand[uVar19 - 1][(long)((long)&pLVar14[1].car + 7)];
                  }
                  lVar7 = (long)local_68 + uVar19 * 0x28 + 8;
                  __dest = *(char **)lVar7;
                  *(undefined8 *)((long)alStack_8970 + lVar2) = 0x1073fe;
                  strcpy(__dest,pcVar16);
                  pcVar16 = buf + uVar19 * 0x11 + -8;
                  __src = *(byte **)lVar7;
                  *(undefined8 *)((long)alStack_8970 + lVar2) = 0x107421;
                  strcpy(pcVar16,(char *)__src);
                  do {
                    if (*pcVar16 == '-') {
                      *pcVar16 = 'x';
                    }
                    else if (*pcVar16 == '\0') goto LAB_0010743e;
                    pcVar16 = pcVar16 + 1;
                  } while( true );
                }
              }
              goto LAB_001074ea;
            }
          }
LAB_00107519:
          if (local_50[1] == 0x940504fe) {
            lVar7 = *local_50;
            if (*(char *)((long)local_50 + lVar7 + -4) == -0x12) {
              if (*(char *)((long)local_50 + lVar7 + -3) == 'A') {
                if (*(char *)((long)local_50 + lVar7 + -2) == 'Q') {
                  if (*(char *)((long)local_50 + lVar7 + -1) == 'Y') {
                    return 1;
                  }
                  pcVar16 = "___tempptr[___newsize-1] == FIREWALL_STOP_3";
                }
                else {
                  pcVar16 = "___tempptr[___newsize-2] == FIREWALL_STOP_2";
                }
              }
              else {
                pcVar16 = "___tempptr[___newsize-3] == FIREWALL_STOP_1";
              }
            }
            else {
              pcVar16 = "___tempptr[___newsize-4] == FIREWALL_STOP_0";
            }
          }
          else {
            pcVar16 = "((long *)___tempptr)[1] == FIREWALL_START";
          }
          *(code **)((long)alStack_8970 + lVar2) = string_to_list;
          __assert_fail(pcVar16,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/autc04[P]syn68k/syngen/parse.c"
                        ,0x1fc,"int parse_defopcode(SymbolTable *, List *)");
        }
        pcVar16 = 
        "Error: too many variants.  Only %d allowed.  To raise, change MAX_VARIANTS in defopcode.h.\n"
        ;
        uVar13 = 0x40;
      }
      else {
        alStack_8970[0] = 0x106dc1;
        uVar4 = list_length(pLVar10);
        pcVar16 = "Missing arguments; should be 4, found %d\n";
        uVar13 = (ulong)uVar4;
      }
      alStack_8970[0] = 0x106dd4;
      parse_error(pLVar10,pcVar16,uVar13);
      iVar5 = 0;
    }
  }
  else {
    alStack_8970[0] = 0x106da8;
    parse_error(new,"Invalid opcode name.  Ignoring...\n");
  }
  return iVar5;
LAB_0010743e:
  if (*__src - 0x30 < 2) {
    *__src = 0x78;
  }
  else if (*__src == 0) goto code_r0x00107452;
  __src = __src + 1;
  goto LAB_0010743e;
code_r0x00107452:
  uVar19 = uVar19 + 1;
  if (uVar19 == uVar13) goto code_r0x0010745e;
  goto LAB_001073be;
code_r0x0010745e:
  if (3 < (int)local_38) {
    ppcVar15 = bits_to_expand[0x3f] + 0x3f;
    uVar19 = uVar13;
    do {
      *(undefined8 *)((long)alStack_8970 + lVar2) = 0x107481;
      iVar5 = strcmp((char *)ppcVar15,"xxxxxxxxxxxxxxxx");
      if (iVar5 != 0) {
        *(undefined8 *)((long)alStack_8970 + lVar2) = 0x10748a;
        pLVar10 = alloc_list();
        (pLVar10->token).type = TOK_LIST;
        *(undefined8 *)((long)alStack_8970 + lVar2) = 0x107499;
        pLVar11 = alloc_list();
        pLVar10->car = pLVar11;
        (pLVar11->token).type = TOK_INTERSECT;
        (pLVar11->token).u.string = "intersect";
        *(undefined8 *)((long)alStack_8970 + lVar2) = 0x1074b5;
        pLVar11 = alloc_list();
        pLVar10->car->cdr = pLVar11;
        (pLVar11->token).type = TOK_QUOTED_STRING;
        (pLVar11->token).u.string = (char *)ppcVar15;
        pLVar10->car->cdr->cdr = local_210;
        local_210 = pLVar10;
      }
      ppcVar15 = (char **)((long)ppcVar15 + 0x11);
      uVar19 = uVar19 - 1;
    } while (uVar19 != 0);
  }
LAB_001074ea:
  *(undefined8 *)((long)alStack_8970 + lVar2) = 0x1074fa;
  generate_opcode((ParsedOpcodeInfo *)&local_220.reginfo,local_80);
  local_210 = local_40;
  local_40->cdr = local_48;
  pLVar14 = (ListStruct *)((long)&pLVar14->cdr + 1);
  if (pLVar14 == local_58) goto LAB_00107519;
  goto LAB_00107376;
}

Assistant:

static int
parse_defopcode (SymbolTable *sym, List *new)
{
  const char *name = NULL;
  List dummy1 = { /* new */ 0, NULL, { /* new->token */ 0 } };
  List dummy2 = { NULL, /* &dummy1 */ 0, { /* new->token */ 0 } };
  SAFE_DECL ();

  dummy1.cdr = new;
  dummy1.token = new->token;
  dummy2.car = &dummy1;
  dummy2.token = new->token;

  dummy1.token.type = TOK_DEFOPCODE;
  dummy1.token.u.string = "defopcode";
  dummy2.token.type = TOK_LIST;
  dummy2.token.u.string = NULL;

  if (new->token.type == TOK_QUOTED_STRING
      || new->token.type == TOK_IDENTIFIER)
    name = new->token.u.string;

  /* Make sure the opcode name is legitimate. */
  if (name == NULL)
    {
      parse_error (new, "Invalid opcode name.  Ignoring...\n");
      return 0;
    }

  /* Perform initial macro substitutions. */
  reduce (&dummy2, sym, 0);

  /* Generate the opcode. */
  if (!preprocess_only)
    {
      ParsedOpcodeInfo info;
      List *l = CDR (CADDAR (&dummy2)), *err;
      CCVariant *var;
      int num_variants;
      List *code_backup[MAX_VARIANTS];
      const char *bits_to_expand[MAX_VARIANTS][MAX_VARIANTS];
      int num_bits_to_expand[MAX_VARIANTS];
      int max_num_bits_to_expand = 0;
      int i;

      num_variants = list_length (&dummy1) - 3;
      if (list_length (l) != 4)
	{
	  parse_error (l, "Missing arguments; should be 4, found %d\n",
		       list_length (l));
	  return 0;
	}

      if (num_variants > MAX_VARIANTS)
	{
	  parse_error (l, "Error: too many variants.  Only %d allowed.  To "
		       "raise, change MAX_VARIANTS in defopcode.h.\n",
		       MAX_VARIANTS);
	  return 0;
	}

      /* Parse in the instruction information. */
      memset (&info, 0, sizeof info);
      info.name = CDAR (&dummy2)->token.u.string;
      info.cpu = l->token.u.n;
      info.amode = CDR (l);
      info.misc_flags = CDDR (l);

      if (info.misc_flags->token.type != TOK_LIST)
	parse_error (info.misc_flags, "Expecting a list of misc flags!\n");
      else
	{
	  List *ls;
	  for (ls = info.misc_flags->car; ls != NULL; ls = ls->cdr)
	    {
	      char buf[256];

	      switch (ls->token.type) {
	      case TOK_ENDS_BLOCK:
		info.ends_block = TRUE;
		break;
	      case TOK_DONT_POSTINCDEC_UNEXPANDED:
		info.dont_postincdec_unexpanded = TRUE;
		break;
	      case TOK_NEXT_BLOCK_DYNAMIC:
		info.next_block_dynamic = TRUE;
		break;
	      case TOK_SKIP_TWO_OPERAND_WORDS:
		info.operand_words_to_skip = 2;
		break;
	      case TOK_SKIP_FOUR_OPERAND_WORDS:
		info.operand_words_to_skip = 4;
		break;
	      case TOK_SKIP_ONE_POINTER:
	        info.operand_words_to_skip = PTR_WORDS;
	        break;
	      case TOK_SKIP_TWO_POINTERS:
	        info.operand_words_to_skip = PTR_WORDS * 2;
	        break;
	      default:
		parse_error (ls, "Unknown misc flag: %s",
			     unparse_token (&ls->token, buf));
		break;
	      }
	    }
	}

      info.opcode_bits[0] = '\0';
      err = CDDDR (l);  /* For later, in case we need it. */
      if (CDDDR (l)->token.type != TOK_LIST)
	{
	  parse_error (CDDDR (l), "Expecting explicit list of opcode bits.\n");
	  strcpy (info.opcode_bits, "0000000000000000");
	}
      else
	for (l = CDR (CADDDR (l)); l != NULL; l = l->cdr)
	  {
	    if (0 && strlen (l->token.u.string) != 16)
	      {
		/* This seems a little harsh... */
		parse_error (l, "Need exactly 16 characters in each bit "
			     "pattern specification string, found %d.\n",
			     strlen (l->token.u.string));
		strcat (info.opcode_bits, "0000000000000000");
	      }
	    else
	      strcat (info.opcode_bits, l->token.u.string);
	  }
      if (strlen (info.opcode_bits) % 16)
	{
	  parse_error (err, "Not a multiple of 16 opcode bits.\n");
	  strcpy (info.opcode_bits, "0000000000000000");
	}
      info.cc_variant = NULL;

      /* Parse the information for the cc variants. */
      var = (CCVariant *) SAFE_alloca (num_variants * sizeof (CCVariant));
      memset (var, 0, num_variants * sizeof (CCVariant));
      info.cc_variant = var;

      /* Loop through and parse each cc variant. */
      for (i = num_variants - 1, l = CDDDR (&dummy1); i >= 0; i--, l = l->cdr)
	{
	  static const struct {
	    char character;
	    unsigned char cc_may_set:1;
	    unsigned char cc_may_not_set:1;
	    unsigned char cc_to_known_value:1;
	    unsigned char cc_known_values:1;
	  } cc_bit_info[] = {
	    { '0', 1, 0, 1, 0 },    /* 0  ->  always force cc bit to 0.    */
	    { '1', 1, 0, 1, 1 },    /* 1  ->  always force cc bit to 1.    */
	    { 'C', 1, 0, 0, 0 },    /* Any letter means will always set    */
	    { 'N', 1, 0, 0, 0 },    /*     cc bit to either 0 or 1, but    */
	    { 'V', 1, 0, 0, 0 },    /*     we can't determine which at     */
	    { 'X', 1, 0, 0, 0 },    /*     compile time.                   */
	    { 'Z', 1, 0, 0, 0 },    /*                                     */
	    { '-', 0, 1, 0, 0 },    /* -  ->  cc bit always unchanged.     */
	    { '>', 1, 1, 0, 0 },    /* >  ->  cc set to 1 or unchanged.    */
	    { '<', 1, 1, 0, 0 },    /* <  ->  cc set to 0 or unchanged.    */
	    { '?', 1, 0, 0, 0 },    /* ?  ->  cc bit undefined.            */
	    { '%', 1, 1, 0, 0 },    /* %  ->  cc might change, might not.  */
	  };
	  int guess, bit;
	  const char *b;
	  List *bte;
	  
	  /* Insert them in reverse order. */
	  if (i > 0)
	    var[i - 1].next = &var[i];

	  /* Parse the cc bits set specs. */
	  b = (CDAR (l))->token.u.string;
	  if (strlen (b) != 5)
	    {
	      parse_error (CDDAR (l), "Need exactly five characters in "
			   "cc bits specification.\n");
	      b = "-----";
	    }
			 
	  for (bit = 0; bit < 5; bit++)
	    {
	      for (guess = sizeof cc_bit_info / sizeof cc_bit_info[0] - 1;
		   guess >= 0; guess--)
		if (cc_bit_info[guess].character == b[4 - bit])
		  {
		    var[i].cc_may_set |= cc_bit_info[guess].cc_may_set << bit;
		    var[i].cc_may_not_set
		      |= cc_bit_info[guess].cc_may_not_set << bit;
		    var[i].cc_to_known_value
		      |= cc_bit_info[guess].cc_to_known_value << bit;
		    var[i].cc_known_values
		      |= cc_bit_info[guess].cc_known_values << bit;
		    break;
		  }
	      if (guess < 0)
		parse_error (CDAR (l), "Unknown character '%c' in cc bit "
			     "specification.\n", b[4 - bit]);
	    }

	  /* Parse the cc bits needed specs. */
	  b = (CDDAR (l))->token.u.string;
	  if (strlen (b) != 5)
	    {
	      parse_error (CDDAR (l), "Need exactly five characters in "
			   "cc bits specification.\n");
	      b = "-----";
	    }
	  
	  for (bit = 0; bit < 5; bit++)
	    {
	      if (strchr ("-CNVXZ", b[4 - bit]) == NULL)
		parse_error (CDDAR (l), "Illegal character '%c' in cc bits "
			     "needed specification.  Must be one of "
			     "-,C,N,V,X,Z.\n",
			     b[4 - bit]);
	      var[i].cc_needed |= (b[4 - bit] != '-') << bit;
	    }


	  /* Fetch all of the bits_to_expand strings into an array.
	   * Terminate the list provided by the user with "----------------"
	   * so we guarantee that all legal bit patterns get code generated
	   * for them.
	   */
	  num_bits_to_expand[i] = 0;
	  bte = CADDR (CDAR (l));
	  if (bte->token.type != TOK_EXPLICIT_LIST)
	    parse_error (bte, "Expecting a list of bit pattern strings.\n");
	  else
	    {
	      for (bte = bte->cdr; bte != NULL; bte = bte->cdr)
		bits_to_expand[i][num_bits_to_expand[i]++]
		  = bte->token.u.string;
	    }
	  bits_to_expand[i][num_bits_to_expand[i]++]
	    = "----------------";
	  if (num_bits_to_expand[i] > max_num_bits_to_expand)
	    max_num_bits_to_expand = num_bits_to_expand[i];
	  var[i].code = CDDR (CDDAR (l));

	  {
	    List *native = CDDR (CDDAR (l));
	    if (native != NULL && CAR (native) != NULL
		&& (CAR (native))->token.type == TOK_NATIVE_CODE)
	      {
		if ((CDAR (native))->token.type != TOK_QUOTED_STRING)
		  parse_error (CAR (native), "Faulty native code specifier.");
#ifdef GENERATE_NATIVE_CODE

		{
		  char buf[1024];
		  List *xx;

		  buf[0] = '\0';
		  for (xx = CDAR (native); xx != NULL; xx = xx->cdr)
		    {
		      if (xx->token.type == TOK_QUOTED_STRING)
			strcat (buf, xx->token.u.string);
		      else
			parse_error (xx, "Expected string here.");
		    }
		  if (buf[0] == '\0' || !strcmp (buf, "none"))
		    var[i].native_code_info = NULL;
		  else
		    var[i].native_code_info = unique_string (buf);
		}
#endif
		var[i].code = native->cdr;
	      }
	    else
	      {
#ifdef GENERATE_NATIVE_CODE
		var[i].native_code_info = NULL;
#endif
		var[i].code = CDDR (CDDAR (l));
	      }
	  }

#ifndef GENERATE_NATIVE_CODE
	  var[i].native_code_info = NULL;
#endif
	}

      /* Verify that all of the fields they specified actually exist. */
      for (i = 0; i < num_variants; i++)
	verify_fields_exist (info.opcode_bits, var[i].code);

      /* Loop through and generate code for each bits_to_expand specified.
       * This is not elegant; originally, only one bits_to_expand string
       * could be specified, and its semantics were more limited than the
       * new, more powerful versions.  To compensate, we will call the
       * lower level routines once for each bits_to_expand string, and
       * modify the legal addressing mode expression to provide us with the
       * new literal bits matching capability of the new bits_to_expand
       * strings.
       */
      
      for (i = 0; i < num_variants; i++)
	{
/*
 * TODO:  FIXME -- I don't like "17" below
 */
	  /* We allocate 17 bytes because we can only expand up to 16
	   * bits, and we have one extra for the terminating 0.
	   */
	  var[i].bits_to_expand = (char *) malloc (17);
	  code_backup[i] = var[i].code;
	}

      for (i = 0; i < max_num_bits_to_expand; i++)
	{
	  char intersect[MAX_VARIANTS][17];
	  List *saved_amode = info.amode;
	  List *old_cdr = info.amode->cdr;
	  int j;
	  
	  info.amode->cdr = NULL;

	  /* Preserve code. */
	  for (j = 0; j < num_variants; j++)
	    var[j].code = copy_list (code_backup[j]);

	  /* Grab all of the bits_to_expand strings. */
	  for (j = 0; j < num_variants; j++)
	    {
	      char *p;
	      strcpy (var[j].bits_to_expand, ((i < num_bits_to_expand[j])
					      ? bits_to_expand[j][i]
					      : "----------------"));
	      
	      /* Generate the intersection string. */
	      strcpy (intersect[j], var[j].bits_to_expand);
	      for (p = intersect[j]; *p != '\0'; p++)
		if (*p == '-')
		  *p = 'x';
	      
	      /* Expand all literal bits by replacing them with 'x'.*/
	      for (p = var[j].bits_to_expand; *p != '\0'; p++)
		if (*p == '0' || *p == '1')
		  *p = 'x';
	    }
	  
	  /* Intersect with all of the literal bits we know about. */
	  for (j = 0; j < num_variants; j++)
	    if (strcmp (intersect[j], "xxxxxxxxxxxxxxxx"))
	      {
		List *isect = alloc_list ();
		isect->token.type = TOK_LIST;
		isect->car = alloc_list ();
		isect->car->token.type = TOK_INTERSECT;
		isect->car->token.u.string = "intersect";
		isect->car->cdr = alloc_list ();
		isect->car->cdr->token.type = TOK_QUOTED_STRING;
		isect->car->cdr->token.u.string = intersect[j];
		isect->car->cdr->cdr = info.amode;
		info.amode = isect;
	      }

	  /* Generate the actual code. */
	  generate_opcode (&info, sym);

	  /* Memory leak here, but who cares? */
	  info.amode = saved_amode;
	  info.amode->cdr = old_cdr;
	}
	ASSERT_SAFE(var);
    }

  return 1;
}